

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optimize.c
# Opt level: O2

_Bool swap_commutative2(TCGArg *p1,TCGArg *p2)

{
  TCGArg TVar1;
  byte bVar2;
  TCGArg t;
  byte bVar3;
  
  TVar1 = *p1;
  bVar2 = **(char **)(p1[1] + 0x30) + **(char **)(TVar1 + 0x30);
  bVar3 = **(char **)(p2[1] + 0x30) + **(char **)(*p2 + 0x30);
  if (bVar3 < bVar2) {
    *p1 = *p2;
    *p2 = TVar1;
    TVar1 = p1[1];
    p1[1] = p2[1];
    p2[1] = TVar1;
  }
  return bVar3 < bVar2;
}

Assistant:

static bool swap_commutative2(TCGArg *p1, TCGArg *p2)
{
    int sum = 0;
    sum += arg_is_const(p1[0]);
    sum += arg_is_const(p1[1]);
    sum -= arg_is_const(p2[0]);
    sum -= arg_is_const(p2[1]);
    if (sum > 0) {
        TCGArg t;
        t = p1[0], p1[0] = p2[0], p2[0] = t;
        t = p1[1], p1[1] = p2[1], p2[1] = t;
        return true;
    }
    return false;
}